

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsXMLReader.cxx
# Opt level: O2

bool __thiscall kws::XMLReader::Open(XMLReader *this,char *filename)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  
  std::ifstream::open((char *)this,(_Ios_Openmode)filename);
  uVar1 = *(uint *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18));
  if ((uVar1 & 5) == 0) {
    std::istream::seekg((long)this,_S_beg);
    lVar2 = std::istream::tellg();
    std::istream::seekg((long)this,_S_beg);
    pvVar3 = operator_new__(lVar2 + 1);
    std::istream::read((char *)this,(long)pvVar3);
    *(undefined1 *)((long)pvVar3 + lVar2) = 0;
    std::__cxx11::string::assign((char *)&this->m_Buffer);
    std::__cxx11::string::resize((ulong)&this->m_Buffer);
    operator_delete__(pvVar3);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool XMLReader::Open(const char* filename)
{
  // Open file for reading
  m_File.open(filename,std::ifstream::binary);
  if ( m_File.fail() )
    {
    return false;
    }

  m_File.seekg(0,std::ios::end);
  unsigned long fileSize = static_cast<unsigned long>(m_File.tellg());
  m_File.seekg(0,std::ios::beg);

  char* buf = new char[fileSize+1];
  m_File.read(buf,fileSize);
  buf[fileSize] = 0;
  m_Buffer = buf;
  m_Buffer.resize(fileSize);
  delete [] buf;

  return true;
}